

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashsearch.h
# Opt level: O1

bool hashSearch<unsigned_short>
               (vector<unsigned_short,_std::allocator<unsigned_short>_> *keys,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *vals,string *hash_str,string *map_name,string *default_value,uint8_t expansion,
               uint8_t reduction,bool nonKeyLookups)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  uint uVar3;
  _Bit_type *p_Var4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  _Alloc_hider _Var10;
  pointer piVar11;
  bool bVar12;
  uint32_t uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  size_t n;
  long lVar17;
  long *plVar18;
  byte bVar19;
  size_t sVar20;
  long *plVar21;
  ulong uVar22;
  size_type __n;
  byte bVar23;
  ulong *puVar24;
  pointer pcVar25;
  uint uVar26;
  uint8_t active_coeffs;
  byte bVar27;
  size_type sVar28;
  uint uVar29;
  long lVar30;
  long lVar31;
  string upper_name;
  vector<bool,_std::allocator<bool>_> hash_table;
  vector<int,_std::allocator<int>_> mapping;
  array<unsigned_int,_6UL> best_c;
  string local_1d8;
  string *local_1b8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_1b0;
  uint local_1a4;
  uint local_1a0;
  uint local_19c;
  uint local_198;
  uint local_194;
  uint local_190;
  uint local_18c;
  uint local_188;
  uint local_184;
  uint local_180;
  uint local_17c;
  vector<bool,_std::allocator<bool>_> local_178;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  vector<int,_std::allocator<int>_> local_130;
  size_type local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_110;
  string *local_108;
  string *local_100;
  long local_f8;
  pointer local_f0;
  string local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  uint local_68 [2];
  uint auStack_60 [2];
  uint local_58 [4];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  uVar22 = (long)(keys->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(keys->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl
                 .super__Vector_impl_data._M_start >> 1;
  local_1b8 = hash_str;
  local_100 = default_value;
  if (uVar22 < 2) {
    __assert_fail("keys.size() > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/hashsearch.h"
                  ,0x84,
                  "bool hashSearch(const std::vector<KeyType> &, const std::vector<std::string> &, std::string &, std::string, std::string, uint8_t, uint8_t, bool) [KeyType = unsigned short]"
                 );
  }
  local_1b0 = keys;
  bVar12 = hasDuplicates<unsigned_short>(keys);
  if (bVar12) {
    __assert_fail("!hasDuplicates(keys)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/hashsearch.h"
                  ,0x85,
                  "bool hashSearch(const std::vector<KeyType> &, const std::vector<std::string> &, std::string &, std::string, std::string, uint8_t, uint8_t, bool) [KeyType = unsigned short]"
                 );
  }
  if ((long)(vals->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(vals->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start >> 5 != uVar22) {
    __assert_fail("vals.size() == keys.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/hashsearch.h"
                  ,0x86,
                  "bool hashSearch(const std::vector<KeyType> &, const std::vector<std::string> &, std::string &, std::string, std::string, uint8_t, uint8_t, bool) [KeyType = unsigned short]"
                 );
  }
  bVar12 = false;
  n = getModulusBitmask((uVar22 * expansion) / (ulong)reduction);
  __n = n + 1;
  local_1d8._M_dataplus._M_p = local_1d8._M_dataplus._M_p & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_178,__n,(bool *)&local_1d8,(allocator_type *)&local_150);
  uVar6 = c_max._M_elems[2];
  uVar5 = c_max._M_elems[1];
  c._M_elems[0] = c_min._M_elems[0];
  local_1a0 = c_max._M_elems[0];
  uVar26 = (uint)n;
  if (c_min._M_elems[0] <= c_max._M_elems[0]) {
    bVar23 = 7;
    local_1a4 = c_min._M_elems[1];
    local_198 = c_min._M_elems[2];
    uVar14 = c_min._M_elems[0];
    uVar29 = c_min._M_elems[2];
    local_118 = __n;
    local_110 = vals;
    local_108 = map_name;
    do {
      uVar7 = c_max._M_elems[3];
      c._M_elems[1] = local_1a4;
      local_19c = uVar14;
      if (local_1a4 <= uVar5) {
        local_190 = c_min._M_elems[3];
        uVar14 = local_1a4;
        uVar15 = c_min._M_elems[3];
        do {
          uVar8 = c_max._M_elems[4];
          c._M_elems[2] = uVar29;
          local_194 = uVar14;
          if (uVar29 <= uVar6) {
            local_188 = c_min._M_elems[4];
            uVar14 = c_min._M_elems[4];
            do {
              uVar9 = c_max._M_elems[5];
              c._M_elems[3] = uVar15;
              local_18c = uVar29;
              if (uVar15 <= uVar7) {
                local_180 = c_min._M_elems[5];
                uVar29 = c_min._M_elems[5];
                do {
                  c._M_elems[4] = uVar14;
                  local_184 = uVar15;
                  uVar15 = uVar14;
                  uVar14 = local_188;
                  uVar3 = local_17c;
                  p_Var4 = local_178.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                  while (local_17c = uVar15, local_188 = uVar14,
                        local_178.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = p_Var4,
                        local_17c <= uVar8) {
                    c._M_elems[5] = uVar29;
                    if (uVar29 <= uVar9) {
                      puVar2 = (local_1b0->
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                               _M_impl.super__Vector_impl_data._M_start;
                      local_f0 = (local_1b0->
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 )._M_impl.super__Vector_impl_data._M_finish;
                      lVar30 = (long)local_f0 - (long)puVar2;
                      local_f8 = lVar30 >> 1;
                      do {
                        lVar31 = local_f8;
                        lVar17 = 5;
                        bVar27 = 0;
                        do {
                          bVar27 = (bVar27 + 1) - (c._M_elems[lVar17] == 0);
                          bVar12 = lVar17 != 0;
                          lVar17 = lVar17 + -1;
                        } while (bVar12);
                        if (bVar27 < bVar23) {
                          sVar20 = n;
                          if (n != 0xffffffffffffffff) {
                            do {
                              uVar22 = sVar20 + 0x3f;
                              if (-1 < (long)sVar20) {
                                uVar22 = sVar20;
                              }
                              bVar19 = (byte)sVar20 & 0x3f;
                              p_Var4[((long)uVar22 >> 6) +
                                     ((ulong)((sVar20 & 0x800000000000003f) < 0x8000000000000001) -
                                     1)] = p_Var4[((long)uVar22 >> 6) +
                                                  ((ulong)((sVar20 & 0x800000000000003f) <
                                                          0x8000000000000001) - 1)] &
                                           (-2L << bVar19 | 0xfffffffffffffffeU >> 0x40 - bVar19);
                              bVar12 = sVar20 != 0;
                              sVar20 = sVar20 - 1;
                            } while (bVar12);
                          }
                          bVar12 = lVar30 != 0;
                          if (local_f0 != puVar2) {
                            uVar13 = hash((uint)puVar2[local_f8 + -1]);
                            uVar14 = uVar13 & uVar26;
                            bVar19 = (byte)uVar14;
                            uVar22 = p_Var4[uVar14 >> 6];
                            if ((uVar22 >> ((ulong)uVar14 & 0x3f) & 1) != 0) goto LAB_0010e4d2;
                            puVar24 = p_Var4 + (uVar14 >> 6);
                            do {
                              *puVar24 = uVar22 | 1L << (bVar19 & 0x3f);
                              bVar12 = lVar31 != 1;
                              if (lVar31 == 1) break;
                              uVar13 = hash((uint)puVar2[lVar31 + -2]);
                              uVar14 = uVar13 & uVar26;
                              bVar19 = (byte)uVar14;
                              puVar24 = p_Var4 + (uVar14 >> 6);
                              uVar22 = *puVar24;
                              lVar31 = lVar31 + -1;
                            } while ((uVar22 >> ((ulong)uVar14 & 0x3f) & 1) == 0);
                          }
                          if (!bVar12) {
                            local_58[0] = c._M_elems[4];
                            local_58[1] = c._M_elems[5];
                            local_68[0] = c._M_elems[0];
                            local_68[1] = c._M_elems[1];
                            auStack_60[0] = c._M_elems[2];
                            auStack_60[1] = c._M_elems[3];
                            bVar23 = bVar27;
                          }
                        }
LAB_0010e4d2:
                        uVar29 = uVar29 + 1;
                        c._M_elems[5] = uVar29;
                      } while (uVar29 <= uVar9);
                    }
                    c._M_elems[4] = local_17c + 1;
                    uVar15 = local_17c + 1;
                    uVar29 = local_180;
                    uVar14 = local_188;
                    uVar3 = local_17c;
                    p_Var4 = local_178.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                  }
                  uVar15 = local_184 + 1;
                  c._M_elems[3] = uVar15;
                  local_17c = uVar3;
                } while (uVar15 <= uVar7);
              }
              uVar29 = local_18c + 1;
              c._M_elems[2] = uVar29;
              uVar15 = local_190;
            } while (uVar29 <= uVar6);
          }
          uVar14 = local_194 + 1;
          c._M_elems[1] = uVar14;
          uVar29 = local_198;
        } while (uVar14 <= uVar5);
      }
      uVar14 = local_19c + 1;
      c._M_elems[0] = uVar14;
    } while (uVar14 <= local_1a0);
    bVar12 = bVar23 != 7;
    __n = local_118;
    map_name = local_108;
    vals = local_110;
  }
  if (bVar12 != false) {
    c._M_elems[4] = local_58[0];
    c._M_elems[5] = local_58[1];
    c._M_elems[0] = local_68[0];
    c._M_elems[1] = local_68[1];
    c._M_elems[2] = auStack_60[0];
    c._M_elems[3] = auStack_60[1];
    local_1d8._M_dataplus._M_p._0_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_130,__n,(value_type_conflict4 *)&local_1d8,(allocator_type *)&local_150);
    piVar11 = local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar2 = (local_1b0->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
             _M_impl.super__Vector_impl_data._M_start;
    lVar30 = (long)(local_1b0->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
    if (lVar30 != 0) {
      lVar30 = lVar30 >> 1;
      do {
        lVar31 = lVar30 + -1;
        lVar30 = lVar30 + -1;
        uVar13 = hash((uint)puVar2[lVar31]);
        piVar11[uVar13 & uVar26] = (int)lVar30;
      } while (lVar30 != 0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_48,vals);
    pcVar25 = (map_name->_M_dataplus)._M_p;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar25,pcVar25 + map_name->_M_string_length);
    getCommonCodeGen<unsigned_short>
              (&local_1d8,local_1b0,&local_48,&local_130,n,&local_c8,nonKeyLookups);
    std::__cxx11::string::operator=((string *)local_1b8,(string *)&local_1d8);
    paVar1 = &local_1d8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    pcVar25 = (map_name->_M_dataplus)._M_p;
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,pcVar25,pcVar25 + map_name->_M_string_length);
    local_88.field_2._M_allocated_capacity = 0x745f3631746e6975;
    local_88._M_string_length = 8;
    local_88.field_2._M_local_buf[8] = '\0';
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    hashStr(&local_1d8,(uint32_t)pcVar25,n,local_100,&local_e8,&local_88,nonKeyLookups);
    std::__cxx11::string::_M_append((char *)local_1b8,(ulong)local_1d8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    pcVar25 = (map_name->_M_dataplus)._M_p;
    local_1d8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d8,pcVar25,pcVar25 + map_name->_M_string_length);
    _Var10._M_p = local_1d8._M_dataplus._M_p;
    if (local_1d8._M_string_length != 0) {
      sVar28 = 0;
      do {
        iVar16 = toupper((int)_Var10._M_p[sVar28]);
        _Var10._M_p[sVar28] = (char)iVar16;
        sVar28 = sVar28 + 1;
      } while (local_1d8._M_string_length != sVar28);
    }
    std::operator+(&local_a8,"#endif // POIFECT_",&local_1d8);
    plVar18 = (long *)std::__cxx11::string::append((char *)&local_a8);
    plVar21 = plVar18 + 2;
    if ((long *)*plVar18 == plVar21) {
      local_140 = *plVar21;
      lStack_138 = plVar18[3];
      local_150 = &local_140;
    }
    else {
      local_140 = *plVar21;
      local_150 = (long *)*plVar18;
    }
    local_148 = plVar18[1];
    *plVar18 = (long)plVar21;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_1b8,(ulong)local_150);
    if (local_150 != &local_140) {
      operator_delete(local_150,local_140 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  if (local_178.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_178.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_178.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_178.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return bVar12;
}

Assistant:

bool hashSearch(const std::vector<KeyType>& keys,
                const std::vector<std::string>& vals,
                std::string& hash_str,
                std::string map_name = "PoifectMap",
                std::string default_value = "",
                uint8_t expansion = 1,
                uint8_t reduction = 1,
                bool nonKeyLookups = true){
    assert(keys.size() > 1);
    assert(!hasDuplicates(keys));
    assert(vals.size() == keys.size());

    size_t n = getModulusBitmask(keys.size() * expansion / reduction);
    std::vector<bool> hash_table(n+1, false);
    uint8_t best_num_c = c.size()+1;
    std::array<uint32_t, c.size()> best_c;

    #define ITERATE_INDEX(i) for(c[i] = c_min[i]; c[i] <= c_max[i]; c[i]++)

    ITERATE_INDEX(0)
    ITERATE_INDEX(1)
    ITERATE_INDEX(2)
    ITERATE_INDEX(3)
    ITERATE_INDEX(4)
    ITERATE_INDEX(5)
    {
        const uint8_t num_c = checkNonzeroCoeffs();
        if(num_c < best_num_c && !hasCollisions(keys, n, hash_table)){
            best_num_c = num_c;
            best_c = c;
        }
    }

    if(best_num_c == c.size()+1) return false;

    c = best_c;
    std::vector<int> mapping(n+1, -1);
    for(size_t i = keys.size()-1; i < std::numeric_limits<size_t>::max(); i--)
        mapping[hash(keys[i])&n] = i;

    hash_str = getCommonCodeGen(keys, vals, mapping, n, map_name, nonKeyLookups);

    hash_str += hashStr(keys[0], n, default_value, map_name, typeStr(keys[0]), nonKeyLookups);

    std::string upper_name = map_name;
    std::transform(upper_name.begin(), upper_name.end(), upper_name.begin(), toupper);
    hash_str += "#endif // POIFECT_" + upper_name + "_H\n";

    return true;
}